

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitIf(OptimizeInstructions *this,If *curr)

{
  uintptr_t uVar1;
  bool bVar2;
  Expression *pEVar3;
  Block *this_00;
  Drop *pDVar4;
  Expression *in_RCX;
  Expression *right;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  Builder local_188;
  Builder builder;
  
  pEVar3 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar3;
  right = curr->ifFalse;
  if (right == (Expression *)0x0) {
    return;
  }
  if ((pEVar3->_id == UnaryId) && (*(int *)(pEVar3 + 1) == 0x14)) {
    pEVar3 = (Expression *)pEVar3[1].type.id;
    curr->condition = pEVar3;
    in_RCX = curr->ifTrue;
    curr->ifTrue = right;
    curr->ifFalse = in_RCX;
    right = in_RCX;
  }
  if (((pEVar3->type).id == 1) || (bVar2 = ExpressionAnalyzer::equal(curr->ifTrue,right), !bVar2)) {
    optimizeTernary<wasm::If>(this,curr);
    return;
  }
  effects((EffectAnalyzer *)&stack0xfffffffffffffe78,this,curr->condition);
  bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe78);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe78);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id < 2) {
    local_188.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    if (!bVar2) {
      this_00 = (Block *)curr->ifTrue;
      goto LAB_00ad9010;
    }
  }
  else {
    this_00 = (Block *)curr->ifTrue;
    uVar1 = (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    local_188.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    in_RCX = (Expression *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar1 == 1 || bVar2);
    if (uVar1 != 1 && !bVar2) goto LAB_00ad9010;
    if (uVar1 == 1) {
      this_00 = MixedArena::alloc<wasm::Block>(&(local_188.wasm)->allocator);
      if (bVar2) {
        pDVar4 = Builder::makeDrop(&stack0xfffffffffffffe78,curr->condition);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pDVar4);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 curr->ifTrue);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
      Block::finalize(this_00,type_,Unknown);
      goto LAB_00ad9010;
    }
  }
  pDVar4 = Builder::makeDrop(&stack0xfffffffffffffe78,curr->condition);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
  this_00 = Builder::makeSequence(&stack0xfffffffffffffe78,(Expression *)pDVar4,curr->ifTrue,type);
LAB_00ad9010:
  replaceCurrent(this,(Expression *)this_00);
  return;
}

Assistant:

void visitIf(If* curr) {
    curr->condition = optimizeBoolean(curr->condition);
    if (curr->ifFalse) {
      if (auto* unary = curr->condition->dynCast<Unary>()) {
        if (unary->op == EqZInt32) {
          // flip if-else arms to get rid of an eqz
          curr->condition = unary->value;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
      if (curr->condition->type != Type::unreachable &&
          ExpressionAnalyzer::equal(curr->ifTrue, curr->ifFalse)) {
        // The sides are identical, so fold. If we can replace the If with one
        // arm and there are no side effects in the condition, replace it. But
        // make sure not to change a concrete expression to an unreachable
        // expression because we want to avoid having to refinalize.
        bool needCondition = effects(curr->condition).hasSideEffects();
        bool wouldBecomeUnreachable =
          curr->type.isConcrete() && curr->ifTrue->type == Type::unreachable;
        Builder builder(*getModule());
        if (!wouldBecomeUnreachable && !needCondition) {
          return replaceCurrent(curr->ifTrue);
        } else if (!wouldBecomeUnreachable) {
          return replaceCurrent(builder.makeSequence(
            builder.makeDrop(curr->condition), curr->ifTrue));
        } else {
          // Emit a block with the original concrete type.
          auto* ret = builder.makeBlock();
          if (needCondition) {
            ret->list.push_back(builder.makeDrop(curr->condition));
          }
          ret->list.push_back(curr->ifTrue);
          ret->finalize(curr->type);
          return replaceCurrent(ret);
        }
      }
      optimizeTernary(curr);
    }
  }